

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O2

bool __thiscall Kumu::ByteString::Unarchive(ByteString *this,MemIOReader *Reader)

{
  bool bVar1;
  ui32_t tmp_len;
  ui32_t local_8c;
  Result_t local_88;
  
  if (Reader == (MemIOReader *)0x0) {
    __assert_fail("Reader",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                  ,0x23d,"virtual bool Kumu::ByteString::Unarchive(MemIOReader *)");
  }
  bVar1 = MemIOReader::ReadUi32BE(Reader,&local_8c);
  if (bVar1) {
    Capacity(&local_88,this,local_8c);
    Result_t::~Result_t(&local_88);
    if ((-1 < local_88.value) && (bVar1 = MemIOReader::ReadRaw(Reader,this->m_Data,local_8c), bVar1)
       ) {
      this->m_Length = local_8c;
      return true;
    }
  }
  return false;
}

Assistant:

inline virtual bool Unarchive(MemIOReader* Reader) {
	assert(Reader);
	ui32_t tmp_len;
	if ( ! Reader->ReadUi32BE(&tmp_len) ) return false;
	if ( KM_FAILURE(Capacity(tmp_len)) ) return false;
	if ( ! Reader->ReadRaw(m_Data, tmp_len) ) return false;
	m_Length = tmp_len;
	return true;
      }